

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryReporterPluginTest.cpp
# Opt level: O2

void __thiscall
MockMemoryReportFormatter::report_test_end
          (MockMemoryReportFormatter *this,TestResult *result,UtestShell *test)

{
  int iVar1;
  MockSupport *pMVar2;
  undefined4 extraout_var;
  long *plVar3;
  TemporaryDefaultNewAllocator tempAlloc;
  TemporaryDefaultNewAllocator local_60;
  SimpleString local_58;
  SimpleString local_48;
  SimpleString local_38;
  SimpleString local_28;
  
  TemporaryDefaultNewAllocator::TemporaryDefaultNewAllocator(&local_60,previousNewAllocator);
  SimpleString::SimpleString(&local_28,"formatter");
  pMVar2 = mock(&local_28,(MockFailureReporter *)0x0);
  SimpleString::SimpleString(&local_38,"report_test_end");
  iVar1 = (*pMVar2->_vptr_MockSupport[6])(pMVar2,&local_38);
  SimpleString::SimpleString(&local_48,"result");
  plVar3 = (long *)(**(code **)(*(long *)CONCAT44(extraout_var,iVar1) + 0x80))
                             ((long *)CONCAT44(extraout_var,iVar1),&local_48,result);
  SimpleString::SimpleString(&local_58,"test");
  (**(code **)(*plVar3 + 0x80))(plVar3,&local_58,test);
  SimpleString::~SimpleString(&local_58);
  SimpleString::~SimpleString(&local_48);
  SimpleString::~SimpleString(&local_38);
  SimpleString::~SimpleString(&local_28);
  TemporaryDefaultNewAllocator::~TemporaryDefaultNewAllocator(&local_60);
  return;
}

Assistant:

virtual void report_test_end(TestResult* result, UtestShell& test) _override
    {
        TemporaryDefaultNewAllocator tempAlloc(previousNewAllocator);
        mock("formatter").actualCall("report_test_end").withParameter("result", result).withParameter("test", &test);
    }